

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::RelativeTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  long lVar1;
  Type TVar2;
  EnumDescriptor *pEVar3;
  ulong uVar4;
  string containing_type;
  string type;
  string package;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 8) &&
     (TVar2 = FieldDescriptor::type((FieldDescriptor *)this),
     *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10)) {
    __assert_fail("field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM || field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                  ,0x47d,
                  "string google::protobuf::compiler::js::(anonymous namespace)::RelativeTypeName(const FieldDescriptor *)"
                 );
  }
  lVar1 = **(long **)(*(long *)(this + 0x30) + 8);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,lVar1,(*(long **)(*(long *)(this + 0x30) + 8))[1] + lVar1);
  lVar1 = **(long **)(*(long *)(this + 0x58) + 8);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,lVar1,(*(long **)(*(long *)(this + 0x58) + 8))[1] + lVar1);
  std::__cxx11::string::append((char *)&local_88);
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 8) {
    pEVar3 = FieldDescriptor::enum_type((FieldDescriptor *)this);
  }
  else {
    pEVar3 = (EnumDescriptor *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  lVar1 = **(long **)(pEVar3 + 8);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,lVar1,(*(long **)(pEVar3 + 8))[1] + lVar1);
  if (local_60 < local_80) {
    local_80 = local_60;
  }
  if (local_80 != 0) {
    uVar4 = 0;
    do {
      if (*(char *)((long)local_68 + uVar4) != *(char *)((long)local_88 + uVar4)) break;
      uVar4 = uVar4 + 1;
    } while (local_80 != uVar4);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string RelativeTypeName(const FieldDescriptor* field) {
  assert(field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM ||
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  // For a field with an enum or message type, compute a name relative to the
  // path name of the message type containing this field.
  string package = field->file()->package();
  string containing_type = field->containing_type()->full_name() + ".";
  string type = (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) ?
      field->enum_type()->full_name() : field->message_type()->full_name();

  // |prefix| is advanced as we find separators '.' past the common package
  // prefix that yield common prefixes in the containing type's name and this
  // type's name.
  int prefix = 0;
  for (int i = 0; i < type.size() && i < containing_type.size(); i++) {
    if (type[i] != containing_type[i]) {
      break;
    }
    if (type[i] == '.' && i >= package.size()) {
      prefix = i + 1;
    }
  }

  return type.substr(prefix);
}